

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_color2.c
# Opt level: O2

void draw_axis(float x,float y,float a,float a2,float l,float tl,char *label,int ticks,
              char *numformat,float num1,float num2,float num)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  ALLEGRO_FONT *pAVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 in_XMM3_Db;
  undefined8 uVar15;
  undefined4 uVar16;
  double local_e0;
  
  dVar2 = (double)x;
  dVar3 = (double)a;
  dVar4 = cos(dVar3);
  dVar5 = (double)y;
  dVar6 = sin(dVar3);
  uVar15 = CONCAT44(in_XMM3_Db,(float)(dVar6 * -512.0 + dVar5));
  al_draw_line(x,y,(float)(dVar4 * 512.0 + dVar2),uVar15,example.white._0_8_,example.white._8_8_,
               0x3f800000);
  iVar1 = ticks + -1;
  dVar4 = (double)iVar1;
  dVar6 = (double)a2;
  iVar12 = 0;
  if (ticks < 1) {
    ticks = 0;
  }
  local_e0 = 0.0;
  for (; uVar16 = (undefined4)((ulong)uVar15 >> 0x20), ticks != iVar12; iVar12 = iVar12 + 1) {
    dVar7 = cos(dVar3);
    fVar13 = (float)((dVar7 * 512.0 * local_e0) / dVar4 + dVar2);
    dVar7 = sin(dVar3);
    fVar14 = (float)(dVar5 - (dVar7 * 512.0 * local_e0) / dVar4);
    dVar7 = (double)fVar13;
    dVar8 = cos(dVar6);
    dVar9 = (double)fVar14;
    dVar10 = sin(dVar6);
    al_draw_line(fVar13,fVar14,(float)(dVar8 * (double)l + dVar7),
                 CONCAT44(uVar16,(float)(dVar10 * -(double)l + dVar9)),example.white._0_8_,
                 example.white._8_8_,0x3f800000);
    pAVar11 = example.font;
    dVar8 = cos(dVar6);
    dVar10 = sin(dVar6);
    uVar15 = CONCAT44((float)(int)(double)CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc),
                      (float)(int)(dVar10 * -(double)(l + 2.0) + dVar9));
    al_draw_textf(example.white.r,example.white.b,(float)(int)(dVar8 * (double)(l + 2.0) + dVar7),
                  uVar15,(double)(((float)iVar12 * (1.0 - tl)) / (float)iVar1 + tl),pAVar11,2,
                  numformat);
    local_e0 = local_e0 + 1.0;
  }
  dVar4 = (double)(((num1 - tl) * 512.0) / (1.0 - tl));
  dVar6 = cos(dVar3);
  dVar7 = sin(dVar3);
  uVar15 = example.white._0_8_;
  al_draw_filled_circle
            ((float)(dVar6 * dVar4 + dVar2),(float)(dVar5 - dVar7 * dVar4),0x41000000,
             example.white._0_8_,example.white._8_8_);
  pAVar11 = example.font;
  fVar13 = SUB84(uVar15,4);
  dVar4 = cos(dVar3);
  dVar3 = sin(dVar3);
  al_draw_textf(example.white.r,example.white.b,(float)((int)(dVar4 * 516.0 + dVar2) + -0x18),
                CONCAT44(fVar13,(float)((int)(dVar3 * -516.0 + dVar5) + -0xc)),pAVar11,0,"%s",label)
  ;
  return;
}

Assistant:

static void draw_axis(float x, float y, float a, float a2, float l,
      float tl, char const *label, int ticks,
      char const *numformat, float num1, float num2, float num) {
   al_draw_line(x, y, x + l * cos(a), y - l * sin(a), example.white, 1);
   int i;
   for (i = 0; i < ticks; i++) {
      float x2 = x + l * cos(a) * i / (ticks - 1);
      float y2 = y - l * sin(a) * i / (ticks - 1);
      al_draw_line(x2, y2, x2 + tl * cos(a2), y2 - tl * sin(a2), example.white, 1);
      al_draw_textf(example.font, example.white,
         (int)(x2 + (tl + 2) * cos(a2)), (int)(y2 - (tl + 2) * sin(a2)), ALLEGRO_ALIGN_RIGHT, numformat,
         num1 + i * (num2 - num1) / (ticks - 1));
   }
   float lv = (num - num1) * l / (num2 - num1);
   al_draw_filled_circle(x + lv * cos(a), y - lv * sin(a), 8, example.white);
   al_draw_textf(example.font, example.white,
      (int)(x + (l + 4) * cos(a)) - 24, (int)(y - (l + 4) * sin(a)) - 12, 0, "%s", label);
}